

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

void __thiscall ON_SN_BLOCK::SortBlockHelper(ON_SN_BLOCK *this)

{
  uint uVar1;
  anon_union_8_5_72d3814f_for_m_u aVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ON__UINT64 OVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 *puVar10;
  ON__UINT32 OVar11;
  ON__UINT32 OVar12;
  ON__UINT8 OVar13;
  ON__UINT8 OVar14;
  ON__UINT8 OVar15;
  ON__UINT8 OVar16;
  ON__UINT32 OVar17;
  unsigned_short uVar18;
  unsigned_short uVar19;
  uint uVar20;
  unsigned_short uVar21;
  unsigned_short uVar22;
  ON__UINT8 OVar23;
  ON__UINT8 OVar24;
  ON__UINT8 OVar25;
  ON__UINT8 OVar26;
  ON__UINT32 OVar27;
  ON__UINT32 OVar28;
  ON__UINT32 OVar29;
  ulong uVar30;
  SN_ELEMENT *pSVar31;
  ON__UINT64 OVar32;
  long lVar33;
  ulong uVar34;
  SN_ELEMENT *pSVar35;
  SN_ELEMENT *pSVar36;
  SN_ELEMENT *pSVar37;
  int iVar38;
  ulong uVar39;
  SN_ELEMENT *pSVar40;
  SN_ELEMENT *pSVar41;
  SN_ELEMENT *pSVar42;
  SN_ELEMENT *histk [62];
  SN_ELEMENT *lostk [62];
  ulong local_3f8 [62];
  ulong auStack_208 [49];
  SN_ELEMENT tmp;
  
  uVar1 = this->m_count;
  if (1 < (ulong)uVar1) {
    uVar39 = 0;
    pSVar40 = this->m_sn + ((ulong)uVar1 - 1);
    pSVar41 = this->m_sn;
LAB_004e9472:
    while( true ) {
      iVar38 = (int)uVar39;
      uVar30 = ((long)pSVar40 - (long)pSVar41) / 0x38 + 1;
      if (uVar30 < 9) break;
      uVar30 = uVar30 >> 1;
      pSVar31 = pSVar41 + uVar30;
      uVar34 = pSVar41->m_sn;
      if (pSVar41[uVar30].m_sn < uVar34) {
        aVar2 = (pSVar41->m_value).m_u;
        uVar20 = (pSVar41->m_id).Data1;
        uVar21 = (pSVar41->m_id).Data2;
        uVar22 = (pSVar41->m_id).Data3;
        uVar3 = *(undefined8 *)(pSVar41->m_id).Data4;
        OVar32 = pSVar41->m_sn;
        OVar23 = pSVar41->m_sn_active;
        OVar24 = pSVar41->m_id_active;
        OVar25 = pSVar41->m_reserved1;
        OVar26 = pSVar41->m_reserved2;
        OVar27 = pSVar41->m_id_crc32;
        pSVar35 = pSVar41->m_next;
        OVar28 = (pSVar41->m_value).m_u_type;
        OVar29 = (pSVar41->m_value).m_u32;
        (pSVar41->m_value).m_u = (pSVar31->m_value).m_u;
        uVar1 = (pSVar31->m_id).Data1;
        uVar18 = (pSVar31->m_id).Data2;
        uVar19 = (pSVar31->m_id).Data3;
        uVar4 = *(undefined8 *)(pSVar31->m_id).Data4;
        OVar5 = pSVar31->m_sn;
        OVar13 = pSVar31->m_sn_active;
        OVar14 = pSVar31->m_id_active;
        OVar15 = pSVar31->m_reserved1;
        OVar16 = pSVar31->m_reserved2;
        OVar17 = pSVar31->m_id_crc32;
        OVar11 = (pSVar31->m_value).m_u_type;
        OVar12 = (pSVar31->m_value).m_u32;
        pSVar41->m_next = pSVar31->m_next;
        (pSVar41->m_value).m_u_type = OVar11;
        (pSVar41->m_value).m_u32 = OVar12;
        pSVar41->m_sn = OVar5;
        pSVar41->m_sn_active = OVar13;
        pSVar41->m_id_active = OVar14;
        pSVar41->m_reserved1 = OVar15;
        pSVar41->m_reserved2 = OVar16;
        pSVar41->m_id_crc32 = OVar17;
        (pSVar41->m_id).Data1 = uVar1;
        (pSVar41->m_id).Data2 = uVar18;
        (pSVar41->m_id).Data3 = uVar19;
        *(undefined8 *)(pSVar41->m_id).Data4 = uVar4;
        (pSVar31->m_id).Data1 = uVar20;
        (pSVar31->m_id).Data2 = uVar21;
        (pSVar31->m_id).Data3 = uVar22;
        *(undefined8 *)(pSVar31->m_id).Data4 = uVar3;
        pSVar31->m_sn = OVar32;
        pSVar31->m_sn_active = OVar23;
        pSVar31->m_id_active = OVar24;
        pSVar31->m_reserved1 = OVar25;
        pSVar31->m_reserved2 = OVar26;
        pSVar31->m_id_crc32 = OVar27;
        pSVar31->m_next = pSVar35;
        (pSVar31->m_value).m_u_type = OVar28;
        (pSVar31->m_value).m_u32 = OVar29;
        (pSVar31->m_value).m_u = aVar2;
        uVar34 = pSVar41->m_sn;
      }
      uVar30 = pSVar40->m_sn;
      if (uVar30 < uVar34) {
        aVar2 = (pSVar41->m_value).m_u;
        uVar20 = (pSVar41->m_id).Data1;
        uVar21 = (pSVar41->m_id).Data2;
        uVar22 = (pSVar41->m_id).Data3;
        uVar3 = *(undefined8 *)(pSVar41->m_id).Data4;
        OVar32 = pSVar41->m_sn;
        OVar23 = pSVar41->m_sn_active;
        OVar24 = pSVar41->m_id_active;
        OVar25 = pSVar41->m_reserved1;
        OVar26 = pSVar41->m_reserved2;
        OVar27 = pSVar41->m_id_crc32;
        pSVar35 = pSVar41->m_next;
        OVar28 = (pSVar41->m_value).m_u_type;
        OVar29 = (pSVar41->m_value).m_u32;
        (pSVar41->m_value).m_u = (pSVar40->m_value).m_u;
        uVar1 = (pSVar40->m_id).Data1;
        uVar18 = (pSVar40->m_id).Data2;
        uVar19 = (pSVar40->m_id).Data3;
        uVar4 = *(undefined8 *)(pSVar40->m_id).Data4;
        OVar5 = pSVar40->m_sn;
        OVar13 = pSVar40->m_sn_active;
        OVar14 = pSVar40->m_id_active;
        OVar15 = pSVar40->m_reserved1;
        OVar16 = pSVar40->m_reserved2;
        OVar17 = pSVar40->m_id_crc32;
        OVar11 = (pSVar40->m_value).m_u_type;
        OVar12 = (pSVar40->m_value).m_u32;
        pSVar41->m_next = pSVar40->m_next;
        (pSVar41->m_value).m_u_type = OVar11;
        (pSVar41->m_value).m_u32 = OVar12;
        pSVar41->m_sn = OVar5;
        pSVar41->m_sn_active = OVar13;
        pSVar41->m_id_active = OVar14;
        pSVar41->m_reserved1 = OVar15;
        pSVar41->m_reserved2 = OVar16;
        pSVar41->m_id_crc32 = OVar17;
        (pSVar41->m_id).Data1 = uVar1;
        (pSVar41->m_id).Data2 = uVar18;
        (pSVar41->m_id).Data3 = uVar19;
        *(undefined8 *)(pSVar41->m_id).Data4 = uVar4;
        pSVar40->m_sn = OVar32;
        pSVar40->m_sn_active = OVar23;
        pSVar40->m_id_active = OVar24;
        pSVar40->m_reserved1 = OVar25;
        pSVar40->m_reserved2 = OVar26;
        pSVar40->m_id_crc32 = OVar27;
        (pSVar40->m_value).m_u = aVar2;
        pSVar40->m_next = pSVar35;
        (pSVar40->m_value).m_u_type = OVar28;
        (pSVar40->m_value).m_u32 = OVar29;
        (pSVar40->m_id).Data1 = uVar20;
        (pSVar40->m_id).Data2 = uVar21;
        (pSVar40->m_id).Data3 = uVar22;
        *(undefined8 *)(pSVar40->m_id).Data4 = uVar3;
        uVar30 = pSVar40->m_sn;
      }
      pSVar35 = pSVar41;
      pSVar42 = pSVar40;
      if (uVar30 < pSVar31->m_sn) {
        aVar2 = (pSVar31->m_value).m_u;
        uVar20 = (pSVar31->m_id).Data1;
        uVar21 = (pSVar31->m_id).Data2;
        uVar22 = (pSVar31->m_id).Data3;
        uVar3 = *(undefined8 *)(pSVar31->m_id).Data4;
        OVar32 = pSVar31->m_sn;
        OVar23 = pSVar31->m_sn_active;
        OVar24 = pSVar31->m_id_active;
        OVar25 = pSVar31->m_reserved1;
        OVar26 = pSVar31->m_reserved2;
        OVar29 = pSVar31->m_id_crc32;
        pSVar36 = pSVar31->m_next;
        OVar27 = (pSVar31->m_value).m_u_type;
        OVar28 = (pSVar31->m_value).m_u32;
        (pSVar31->m_value).m_u = (pSVar40->m_value).m_u;
        uVar1 = (pSVar40->m_id).Data1;
        uVar18 = (pSVar40->m_id).Data2;
        uVar19 = (pSVar40->m_id).Data3;
        uVar4 = *(undefined8 *)(pSVar40->m_id).Data4;
        OVar5 = pSVar40->m_sn;
        OVar13 = pSVar40->m_sn_active;
        OVar14 = pSVar40->m_id_active;
        OVar15 = pSVar40->m_reserved1;
        OVar16 = pSVar40->m_reserved2;
        OVar17 = pSVar40->m_id_crc32;
        OVar11 = (pSVar40->m_value).m_u_type;
        OVar12 = (pSVar40->m_value).m_u32;
        pSVar31->m_next = pSVar40->m_next;
        (pSVar31->m_value).m_u_type = OVar11;
        (pSVar31->m_value).m_u32 = OVar12;
        pSVar31->m_sn = OVar5;
        pSVar31->m_sn_active = OVar13;
        pSVar31->m_id_active = OVar14;
        pSVar31->m_reserved1 = OVar15;
        pSVar31->m_reserved2 = OVar16;
        pSVar31->m_id_crc32 = OVar17;
        (pSVar31->m_id).Data1 = uVar1;
        (pSVar31->m_id).Data2 = uVar18;
        (pSVar31->m_id).Data3 = uVar19;
        *(undefined8 *)(pSVar31->m_id).Data4 = uVar4;
        (pSVar40->m_value).m_u = aVar2;
        pSVar40->m_next = pSVar36;
        (pSVar40->m_value).m_u_type = OVar27;
        (pSVar40->m_value).m_u32 = OVar28;
        pSVar40->m_sn = OVar32;
        pSVar40->m_sn_active = OVar23;
        pSVar40->m_id_active = OVar24;
        pSVar40->m_reserved1 = OVar25;
        pSVar40->m_reserved2 = OVar26;
        pSVar40->m_id_crc32 = OVar29;
        (pSVar40->m_id).Data1 = uVar20;
        (pSVar40->m_id).Data2 = uVar21;
        (pSVar40->m_id).Data3 = uVar22;
        *(undefined8 *)(pSVar40->m_id).Data4 = uVar3;
      }
LAB_004e9601:
      pSVar36 = pSVar35;
      if (pSVar35 < pSVar31) {
        do {
          pSVar35 = pSVar36 + 1;
          if (pSVar31 <= pSVar35) break;
          pSVar37 = pSVar36 + 1;
          pSVar36 = pSVar35;
        } while (pSVar37->m_sn <= pSVar31->m_sn);
      }
      pSVar36 = pSVar35;
      if (pSVar31 <= pSVar35) {
        do {
          pSVar36 = pSVar35 + 1;
          if (pSVar40 < pSVar36) break;
          pSVar37 = pSVar35 + 1;
          pSVar35 = pSVar36;
        } while (pSVar37->m_sn <= pSVar31->m_sn);
      }
      do {
        pSVar35 = pSVar36;
        pSVar37 = pSVar42;
        pSVar42 = pSVar37 + -1;
        if (pSVar42 <= pSVar31) break;
        pSVar36 = pSVar35;
      } while (pSVar31->m_sn < *(ulong *)((long)(pSVar37 + -1) + 0x10));
      if (pSVar35 <= pSVar42) {
        aVar2 = (pSVar35->m_value).m_u;
        uVar20 = (pSVar35->m_id).Data1;
        uVar21 = (pSVar35->m_id).Data2;
        uVar22 = (pSVar35->m_id).Data3;
        uVar3 = *(undefined8 *)(pSVar35->m_id).Data4;
        OVar32 = pSVar35->m_sn;
        uVar4 = *(undefined8 *)&pSVar35->m_sn_active;
        pSVar36 = pSVar35->m_next;
        uVar6 = *(undefined8 *)&pSVar35->m_value;
        (pSVar35->m_value).m_u = *(anon_union_8_5_72d3814f_for_m_u *)((long)(pSVar37 + -1) + 0x30);
        uVar1 = (pSVar42->m_id).Data1;
        uVar18 = (pSVar42->m_id).Data2;
        uVar19 = (pSVar42->m_id).Data3;
        uVar7 = *(undefined8 *)((long)(pSVar37 + -1) + 8);
        OVar5 = *(ON__UINT64 *)((long)(pSVar37 + -1) + 0x10);
        uVar8 = *(undefined8 *)((long)(pSVar37 + -1) + 0x18);
        uVar9 = *(undefined8 *)((long)(pSVar37 + -1) + 0x28);
        pSVar35->m_next = *(SN_ELEMENT **)((long)(pSVar37 + -1) + 0x20);
        (pSVar35->m_value).m_u_type = (int)uVar9;
        (pSVar35->m_value).m_u32 = (int)((ulong)uVar9 >> 0x20);
        pSVar35->m_sn = OVar5;
        pSVar35->m_sn_active = (char)uVar8;
        pSVar35->m_id_active = (char)((ulong)uVar8 >> 8);
        pSVar35->m_reserved1 = (char)((ulong)uVar8 >> 0x10);
        pSVar35->m_reserved2 = (char)((ulong)uVar8 >> 0x18);
        pSVar35->m_id_crc32 = (int)((ulong)uVar8 >> 0x20);
        (pSVar35->m_id).Data1 = uVar1;
        (pSVar35->m_id).Data2 = uVar18;
        (pSVar35->m_id).Data3 = uVar19;
        *(undefined8 *)(pSVar35->m_id).Data4 = uVar7;
        *(anon_union_8_5_72d3814f_for_m_u *)((long)(pSVar37 + -1) + 0x30) = aVar2;
        *(SN_ELEMENT **)((long)(pSVar37 + -1) + 0x20) = pSVar36;
        *(undefined8 *)((long)(pSVar37 + -1) + 0x28) = uVar6;
        *(ON__UINT64 *)((long)(pSVar37 + -1) + 0x10) = OVar32;
        *(undefined8 *)((long)(pSVar37 + -1) + 0x18) = uVar4;
        (pSVar42->m_id).Data1 = uVar20;
        (pSVar42->m_id).Data2 = uVar21;
        (pSVar42->m_id).Data3 = uVar22;
        *(undefined8 *)((long)(pSVar37 + -1) + 8) = uVar3;
        if (pSVar42 == pSVar31) {
          pSVar31 = pSVar35;
        }
        goto LAB_004e9601;
      }
      if (pSVar31 < pSVar37) {
        do {
          pSVar37 = pSVar42;
          if (pSVar37 <= pSVar31) break;
          pSVar42 = pSVar37 + -1;
        } while (pSVar37->m_sn == pSVar31->m_sn);
      }
      pSVar42 = pSVar37;
      if (pSVar37 <= pSVar31) {
        do {
          pSVar37 = pSVar42 + -1;
          if (pSVar37 <= pSVar41) break;
          puVar10 = (undefined1 *)(pSVar42 + -1);
          pSVar42 = pSVar37;
        } while (*(ON__UINT64 *)(puVar10 + 0x10) == pSVar31->m_sn);
      }
      if ((long)pSVar37 - (long)pSVar41 < (long)pSVar40 - (long)pSVar35) goto LAB_004e9801;
      if (pSVar41 < pSVar37) {
        auStack_208[iVar38] = (ulong)pSVar41;
        local_3f8[iVar38] = (ulong)pSVar37;
        uVar39 = (ulong)(iVar38 + 1);
      }
      iVar38 = (int)uVar39;
      pSVar41 = pSVar35;
      if (pSVar40 <= pSVar35) goto LAB_004e9823;
    }
    for (; pSVar35 = pSVar41, pSVar31 = pSVar41, pSVar41 < pSVar40; pSVar40 = pSVar40 + -1) {
      while (pSVar42 = pSVar35, pSVar35 = pSVar31 + 1, pSVar35 <= pSVar40) {
        pSVar36 = pSVar31 + 1;
        pSVar31 = pSVar35;
        if (pSVar36->m_sn <= pSVar42->m_sn) {
          pSVar35 = pSVar42;
        }
      }
      aVar2 = (pSVar42->m_value).m_u;
      uVar20 = (pSVar42->m_id).Data1;
      uVar21 = (pSVar42->m_id).Data2;
      uVar22 = (pSVar42->m_id).Data3;
      uVar3 = *(undefined8 *)(pSVar42->m_id).Data4;
      OVar32 = pSVar42->m_sn;
      OVar23 = pSVar42->m_sn_active;
      OVar24 = pSVar42->m_id_active;
      OVar25 = pSVar42->m_reserved1;
      OVar26 = pSVar42->m_reserved2;
      OVar29 = pSVar42->m_id_crc32;
      pSVar31 = pSVar42->m_next;
      OVar27 = (pSVar42->m_value).m_u_type;
      OVar28 = (pSVar42->m_value).m_u32;
      (pSVar42->m_value).m_u = (pSVar40->m_value).m_u;
      uVar1 = (pSVar40->m_id).Data1;
      uVar18 = (pSVar40->m_id).Data2;
      uVar19 = (pSVar40->m_id).Data3;
      uVar4 = *(undefined8 *)(pSVar40->m_id).Data4;
      OVar5 = pSVar40->m_sn;
      OVar13 = pSVar40->m_sn_active;
      OVar14 = pSVar40->m_id_active;
      OVar15 = pSVar40->m_reserved1;
      OVar16 = pSVar40->m_reserved2;
      OVar17 = pSVar40->m_id_crc32;
      OVar11 = (pSVar40->m_value).m_u_type;
      OVar12 = (pSVar40->m_value).m_u32;
      pSVar42->m_next = pSVar40->m_next;
      (pSVar42->m_value).m_u_type = OVar11;
      (pSVar42->m_value).m_u32 = OVar12;
      pSVar42->m_sn = OVar5;
      pSVar42->m_sn_active = OVar13;
      pSVar42->m_id_active = OVar14;
      pSVar42->m_reserved1 = OVar15;
      pSVar42->m_reserved2 = OVar16;
      pSVar42->m_id_crc32 = OVar17;
      (pSVar42->m_id).Data1 = uVar1;
      (pSVar42->m_id).Data2 = uVar18;
      (pSVar42->m_id).Data3 = uVar19;
      *(undefined8 *)(pSVar42->m_id).Data4 = uVar4;
      (pSVar40->m_value).m_u = aVar2;
      pSVar40->m_next = pSVar31;
      (pSVar40->m_value).m_u_type = OVar27;
      (pSVar40->m_value).m_u32 = OVar28;
      pSVar40->m_sn = OVar32;
      pSVar40->m_sn_active = OVar23;
      pSVar40->m_id_active = OVar24;
      pSVar40->m_reserved1 = OVar25;
      pSVar40->m_reserved2 = OVar26;
      pSVar40->m_id_crc32 = OVar29;
      (pSVar40->m_id).Data1 = uVar20;
      (pSVar40->m_id).Data2 = uVar21;
      (pSVar40->m_id).Data3 = uVar22;
      *(undefined8 *)(pSVar40->m_id).Data4 = uVar3;
    }
    goto LAB_004e9823;
  }
  if (uVar1 == 1) {
    OVar32 = this->m_sn[0].m_sn;
  }
  else {
    OVar32 = 0;
  }
  this->m_sn1 = OVar32;
  lVar33 = 0x10;
LAB_004e9882:
  *(ON__UINT64 *)((long)(&this->m_sn[0].m_id + -2) + lVar33) = OVar32;
  this->m_sorted = 1;
  return;
LAB_004e9801:
  if (pSVar35 < pSVar40) {
    auStack_208[iVar38] = (ulong)pSVar35;
    local_3f8[iVar38] = (ulong)pSVar40;
    uVar39 = (ulong)(iVar38 + 1);
  }
  iVar38 = (int)uVar39;
  pSVar40 = pSVar37;
  if (pSVar41 < pSVar37) goto LAB_004e9472;
LAB_004e9823:
  if (0 < iVar38) {
    uVar39 = (ulong)(iVar38 - 1);
    pSVar41 = (SN_ELEMENT *)auStack_208[uVar39];
    pSVar40 = (SN_ELEMENT *)local_3f8[uVar39];
    goto LAB_004e9472;
  }
  this->m_sn0 = this->m_sn[0].m_sn;
  OVar32 = this->m_sn[this->m_count - 1].m_sn;
  lVar33 = 0x18;
  goto LAB_004e9882;
}

Assistant:

void ON_SN_BLOCK::SortBlockHelper()
{
  // Sort m_sn[] by serial number.
  //
  // This is a high speed helper function.  
  //
  // The calling function verify:
  //   m_sorted is zero
  //   m_purged is zero
  //   m_count > 0
  //
  // The array m_sn[] is almost always nearly sorted,
  // so the sort used here should efficiently
  // handle almost sorted arrays. In the past,
  // heap sort was the best choice, but the qsort()
  // in VS 2010 is now a better choice than heap sort.
   
  if ( m_count > 1 )
  {
#if 1
    // Quick sort
    ON_qsort_SN_ELEMENT(m_sn, (size_t)m_count);
#else
    // Heap sort
    size_t i, j, k, i_end;
    struct SN_ELEMENT e_tmp;
    struct SN_ELEMENT* e;

    e = m_sn;

    k = m_count >> 1;
    i_end = m_count-1;
    for (;;) 
    {
      if (k)
      {
        --k;
        e_tmp = e[k];
      } 
      else 
      {
        e_tmp = e[i_end];
        e[i_end] = e[0];
        if (!(--i_end)) 
        {
          e[0] = e_tmp;
          break;
        }
      }

      i = k;
      j = (k<<1) + 1;
      while (j <= i_end)
      {
        if (j < i_end && e[j].m_sn < e[j + 1].m_sn)
          j++;
        if (e_tmp.m_sn < e[j].m_sn)
        {
          e[i] = e[j];
          i = j;
          j = (j<<1) + 1;
        } 
        else 
          j = i_end + 1;
      }
      e[i] = e_tmp;
    }
#endif
    m_sn0 = m_sn[0].m_sn;
    m_sn1 = m_sn[m_count-1].m_sn;
  }
  else
  {
    m_sn0 = m_sn1 = ((1 == m_count) ? m_sn[0].m_sn : 0);
  }
  m_sorted = 1;
}